

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::DirtyFontFaceRecursive(Element *this)

{
  int iVar1;
  Element *this_00;
  int local_18;
  int i;
  int num_children;
  Element *this_local;
  
  ElementStyle::DirtyProperty(&this->meta->style,FontSize);
  Style::ComputedValues::font_face_handle(&this->meta->computed_values,0);
  iVar1 = GetNumChildren(this,true);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    this_00 = GetChild(this,local_18);
    DirtyFontFaceRecursive(this_00);
  }
  return;
}

Assistant:

void Element::DirtyFontFaceRecursive()
{
	// Dirty the font size to force the element to update the face handle during the next Update(), and update any existing text geometry.
	meta->style.DirtyProperty(PropertyId::FontSize);
	meta->computed_values.font_face_handle(0);

	const int num_children = GetNumChildren(true);
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->DirtyFontFaceRecursive();
}